

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse_extra.c
# Opt level: O0

void mod2sparse_merge_vec(mod2sparse *m1,char *vec,int n,mod2sparse *m2)

{
  int *in_RCX;
  int in_EDX;
  mod2sparse *in_RSI;
  mod2sparse *in_RDI;
  int i;
  int ncols;
  int local_28;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (((in_RCX[1] < in_RDI->n_cols + 1) || (*in_RCX < in_RDI->n_rows)) || (*in_RCX < in_EDX)) {
    printf("mod2sparse_merge_vec: the receiving matrix doesn\'t have the good dimensions");
  }
  mod2sparse_copy(in_RSI,(mod2sparse *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  for (local_28 = 0; local_28 < in_EDX; local_28 = local_28 + 1) {
    if (*(char *)((long)&in_RSI->n_rows + (long)local_28) != '\0') {
      mod2sparse_insert(in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
    }
  }
  return;
}

Assistant:

void mod2sparse_merge_vec(mod2sparse* m1, char *vec, int n, mod2sparse* m2) {

    if (mod2sparse_cols(m2) < mod2sparse_cols(m1) + 1 || mod2sparse_rows(m2) < mod2sparse_rows(m1)  || mod2sparse_rows(m2) < n) {
        printf("mod2sparse_merge_vec: the receiving matrix doesn't have the good dimensions");
    }

    mod2sparse_copy(m1,m2);

    int ncols = mod2sparse_cols(m1);
 
    for (int i = 0; i < n; i++){
        if (vec[i] != 0){ 
            mod2sparse_insert(m2,i,ncols);
        }
    }

}